

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidConvolution3DNoWeights(void)

{
  ModelDescription *pMVar1;
  FeatureType *pFVar2;
  ostream *poVar3;
  Result local_f0;
  Convolution3DLayerParams *params;
  NeuralNetworkLayer *convLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *local_90;
  FeatureDescription *topIn;
  int pad_right;
  int pad_left;
  int pad_bottom;
  int pad_top;
  int pad_back;
  int pad_front;
  int dilation_width;
  int dilation_height;
  int dilation_depth;
  int stride_width;
  int stride_height;
  int stride_depth;
  int nGroups;
  int kernel_width;
  int kernel_height;
  int kernel_depth;
  int output_channels;
  int input_channels;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&output_channels);
  kernel_depth = 3;
  kernel_height = 3;
  kernel_width = 3;
  nGroups = 3;
  stride_depth = 3;
  stride_height = 1;
  stride_width = 1;
  dilation_depth = 1;
  dilation_height = 1;
  dilation_width = 1;
  pad_front = 1;
  pad_back = 1;
  pad_top = 0;
  pad_bottom = 0;
  pad_left = 0;
  pad_right = 0;
  topIn._4_4_ = 0;
  topIn._0_4_ = 0;
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&output_channels);
  local_90 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(local_90,"input");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(local_90);
  out3 = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,1);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,0x20);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,100);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,100);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&output_channels);
  nn = (NeuralNetwork *)CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nn,"probs");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)nn);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  convLayer = (NeuralNetworkLayer *)
              CoreML::Specification::Model::mutable_neuralnetwork((Model *)&output_channels);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping
            ((NeuralNetwork *)convLayer,EXACT_ARRAY_MAPPING);
  params = (Convolution3DLayerParams *)
           CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)convLayer);
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)params,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)params,"probs");
  local_f0.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_convolution3d
                 ((NeuralNetworkLayer *)params);
  CoreML::Specification::Convolution3DLayerParams::set_inputchannels
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,kernel_depth);
  CoreML::Specification::Convolution3DLayerParams::set_outputchannels
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,kernel_height);
  CoreML::Specification::Convolution3DLayerParams::set_kerneldepth
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,kernel_width);
  CoreML::Specification::Convolution3DLayerParams::set_kernelheight
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,nGroups);
  CoreML::Specification::Convolution3DLayerParams::set_kernelwidth
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,stride_depth);
  CoreML::Specification::Convolution3DLayerParams::set_ngroups
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,stride_height);
  CoreML::Specification::Convolution3DLayerParams::set_stridedepth
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,stride_width);
  CoreML::Specification::Convolution3DLayerParams::set_strideheight
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,dilation_depth);
  CoreML::Specification::Convolution3DLayerParams::set_stridewidth
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,dilation_height);
  CoreML::Specification::Convolution3DLayerParams::set_dilationdepth
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,dilation_width);
  CoreML::Specification::Convolution3DLayerParams::set_dilationheight
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,pad_front);
  CoreML::Specification::Convolution3DLayerParams::set_dilationwidth
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,pad_back);
  CoreML::Specification::Convolution3DLayerParams::set_paddingtype
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,
             Convolution3DLayerParams_PaddingType_CUSTOM);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingfront
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,pad_top);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingback
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,pad_bottom);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingtop
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,pad_left);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingbottom
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,pad_right);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingleft
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,topIn._4_4_);
  CoreML::Specification::Convolution3DLayerParams::set_custompaddingright
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,(int32)topIn);
  CoreML::Specification::Convolution3DLayerParams::set_hasbias
            ((Convolution3DLayerParams *)local_f0.m_message._M_storage._M_storage,false);
  CoreML::validate<(MLModelType)500>(&local_f0,(Model *)&output_channels);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good(&local_f0);
  if (m1._oneof_case_[0]._0_1_) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x7ba);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"!((res).good())");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result(&local_f0);
  CoreML::Specification::Model::~Model((Model *)&output_channels);
  return m1._oneof_case_[0];
}

Assistant:

int testInvalidConvolution3DNoWeights() {

    Specification::Model m1;

    int input_channels = 3;
    int output_channels = 3;
    int kernel_depth = 3;
    int kernel_height = 3;
    int kernel_width = 3;
    int nGroups = 1;
    int stride_depth = 1;
    int stride_height = 1;
    int stride_width = 1;
    int dilation_depth = 1;
    int dilation_height = 1;
    int dilation_width = 1;
    int pad_front = 0;
    int pad_back = 0;
    int pad_top = 0;
    int pad_bottom = 0;
    int pad_left = 0;
    int pad_right = 0;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    shape->add_shape(3);
    shape->add_shape(32);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution3d();
    params->set_inputchannels(input_channels);
    params->set_outputchannels(output_channels);
    params->set_kerneldepth(kernel_depth);
    params->set_kernelheight(kernel_height);
    params->set_kernelwidth(kernel_width);
    params->set_ngroups(nGroups);
    params->set_stridedepth(stride_depth);
    params->set_strideheight(stride_height);
    params->set_stridewidth(stride_width);
    params->set_dilationdepth(dilation_depth);
    params->set_dilationheight(dilation_height);
    params->set_dilationwidth(dilation_width);
    params->set_paddingtype(CoreML::Specification::Convolution3DLayerParams_PaddingType_CUSTOM);
    params->set_custompaddingfront(pad_front);
    params->set_custompaddingback(pad_back);
    params->set_custompaddingtop(pad_top);
    params->set_custompaddingbottom(pad_bottom);
    params->set_custompaddingleft(pad_left);
    params->set_custompaddingright(pad_right);

    params->set_hasbias(false);

    // Not specifying any weights should be invalid
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;

}